

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_sse4.c
# Opt level: O2

void highbd_8_obmc_variance
               (uint8_t *pre8,int pre_stride,int32_t *wsrc,int32_t *mask,int w,int h,uint *sse,
               int *sum)

{
  uint64_t sse64;
  int64_t sum64;
  
  sum64 = 0;
  sse64 = 0;
  if (w == 4) {
    hbd_obmc_variance_w4(pre8,pre_stride,wsrc,mask,&sse64,&sum64,h);
  }
  else {
    hbd_obmc_variance_w8n(pre8,pre_stride,wsrc,mask,&sse64,&sum64,w,h);
  }
  *sum = (int)sum64;
  *sse = (uint)sse64;
  return;
}

Assistant:

static inline void highbd_8_obmc_variance(const uint8_t *pre8, int pre_stride,
                                          const int32_t *wsrc,
                                          const int32_t *mask, int w, int h,
                                          unsigned int *sse, int *sum) {
  int64_t sum64 = 0;
  uint64_t sse64 = 0;
  if (w == 4) {
    hbd_obmc_variance_w4(pre8, pre_stride, wsrc, mask, &sse64, &sum64, h);
  } else {
    hbd_obmc_variance_w8n(pre8, pre_stride, wsrc, mask, &sse64, &sum64, w, h);
  }
  *sum = (int)sum64;
  *sse = (unsigned int)sse64;
}